

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalParse
          (CodeGeneratorResponse_File *this,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  string *psVar2;
  GeneratedCodeInfo *msg;
  ulong tag_00;
  UnknownFieldSet *unknown;
  string *str_2;
  string *str_1;
  string *str;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  CodeGeneratorResponse_File *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits((HasBits<1UL> *)((long)&str + 4));
  do {
    bVar1 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_004d8faa;
    ctx_local = (ParseContext *)internal::ReadTag((char *)ctx_local,(uint32_t *)&str,0);
    this_00 = _tag;
    switch((uint)str >> 3) {
    case 1:
      if (((uint)str & 0xff) != 10) break;
      psVar2 = _internal_mutable_name_abi_cxx11_(this);
      ctx_local = (ParseContext *)internal::InlineGreedyStringParser(psVar2,(char *)ctx_local,_tag);
      internal::VerifyUTF8(psVar2,"google.protobuf.compiler.CodeGeneratorResponse.File.name");
      goto joined_r0x004d8e72;
    case 2:
      if (((uint)str & 0xff) == 0x12) {
        psVar2 = _internal_mutable_insertion_point_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    internal::InlineGreedyStringParser(psVar2,(char *)ctx_local,_tag);
        internal::VerifyUTF8
                  (psVar2,"google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
        goto joined_r0x004d8e72;
      }
      break;
    default:
      break;
    case 0xf:
      if (((uint)str & 0xff) == 0x7a) {
        psVar2 = _internal_mutable_content_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    internal::InlineGreedyStringParser(psVar2,(char *)ctx_local,_tag);
        internal::VerifyUTF8(psVar2,"google.protobuf.compiler.CodeGeneratorResponse.File.content");
        goto joined_r0x004d8e72;
      }
      break;
    case 0x10:
      if (((uint)str & 0xff) == 0x82) {
        msg = _internal_mutable_generated_code_info(this);
        ctx_local = (ParseContext *)
                    internal::ParseContext::ParseMessage
                              (this_00,(MessageLite *)msg,(char *)ctx_local);
        goto joined_r0x004d8e72;
      }
    }
    if (((uint)str == 0) || (((uint)str & 7) == 4)) {
      if (ctx_local != (ParseContext *)0x0) {
        internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,(uint)str);
        goto LAB_004d8faa;
      }
      goto LAB_004d8fc5;
    }
    tag_00 = (ulong)(uint)str;
    unknown = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                        (&(this->super_Message).super_MessageLite._internal_metadata_);
    ctx_local = (ParseContext *)internal::UnknownFieldParse(tag_00,unknown,(char *)ctx_local,_tag);
joined_r0x004d8e72:
    if (ctx_local == (ParseContext *)0x0) {
LAB_004d8fc5:
      ctx_local = (ParseContext *)0x0;
LAB_004d8faa:
      internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse_File::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string insertion_point = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_insertion_point();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string content = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          auto str = _internal_mutable_content();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.content");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.GeneratedCodeInfo generated_code_info = 16;
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 130)) {
          ptr = ctx->ParseMessage(_internal_mutable_generated_code_info(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}